

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int UnixDir_Read(void *pUserData,jx9_context *pCtx)

{
  char *zString;
  char cVar1;
  dirent *pdVar2;
  uint nLen;
  char *pcVar3;
  
  pdVar2 = readdir((DIR *)pUserData);
  do {
    if (pdVar2 == (dirent *)0x0) {
      return -1;
    }
    zString = pdVar2->d_name;
    pcVar3 = zString;
    cVar1 = pdVar2->d_name[0];
    while (cVar1 != '\0') {
      if (pcVar3[1] == '\0') {
        pcVar3 = pcVar3 + 1;
        break;
      }
      if (pcVar3[2] == '\0') {
        pcVar3 = pcVar3 + 2;
        break;
      }
      if (pcVar3[3] == '\0') {
        pcVar3 = pcVar3 + 3;
        break;
      }
      cVar1 = pcVar3[4];
      pcVar3 = pcVar3 + 4;
    }
    nLen = (int)pcVar3 - (int)zString;
    if (((pdVar2->d_name[0] != '.') || (2 < nLen)) || ((nLen == 2 && (pdVar2->d_name[1] != '.')))) {
      jx9_value_string(pCtx->pRet,zString,nLen);
      return 0;
    }
    pdVar2 = readdir((DIR *)pUserData);
  } while( true );
}

Assistant:

static int UnixDir_Read(void *pUserData, jx9_context *pCtx)
{
	DIR *pDir = (DIR *)pUserData;
	struct dirent *pEntry;
	char *zName = 0; /* cc warning */
	sxu32 n = 0;
	for(;;){
		pEntry = readdir(pDir);
		if( pEntry == 0 ){
			/* No more entries to process */
			return -1;
		}
		zName = pEntry->d_name; 
		n = SyStrlen(zName);
		/* Ignore '.' && '..' */
		if( n > sizeof("..")-1 || zName[0] != '.' || ( n == sizeof("..")-1 && zName[1] != '.') ){
			break;
		}
		/* Next entry */
	}
	/* Return the current file name */
	jx9_result_string(pCtx, zName, (int)n);
	return JX9_OK;
}